

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsCreateCustomExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *pRVar6;
  CustomExternalWrapperObject *pCVar7;
  undefined4 *puVar8;
  AutoNestedHandledExceptionType local_88 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_88,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar6 = (RecyclableObject *)0x0;
    }
    else {
      BVar5 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar5 == 0) {
        JVar4 = JsErrorArgumentNotObject;
        goto LAB_003c3362;
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003c3362;
        prototype = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    JVar4 = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      _actionEntryPopper.m_resultPtr = (TTDVar *)0x0;
      pCVar7 = Js::CustomExternalWrapperObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,
                          (JsGetterSetterInterceptor **)&_actionEntryPopper.m_resultPtr,pRVar6,
                          scriptContext);
      *object = pCVar7;
      if (_actionEntryPopper.m_resultPtr == (TTDVar *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                           ,0x2ba,"(interceptor)","interceptor");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      *getterSetterInterceptor = (JsGetterSetterInterceptor *)_actionEntryPopper.m_resultPtr;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JsValueRef *)_actionEntryPopper.m_actionEvent = *object;
      }
      JVar4 = JsNoError;
    }
  }
LAB_003c3362:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_88);
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateCustomExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _Inout_opt_ JsGetterSetterInterceptor ** getterSetterInterceptor,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef * object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }

        Js::JsGetterSetterInterceptor * interceptor = nullptr;
        *object = Js::CustomExternalWrapperObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, &interceptor, prototypeObject, scriptContext);
        Assert(interceptor);
        *getterSetterInterceptor = reinterpret_cast<JsGetterSetterInterceptor*>(interceptor);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}